

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void mod_sqrt(uECC_word_t *a)

{
  uECC_word_t uVar1;
  uECC_word_t local_58;
  uECC_word_t l_result [4];
  uECC_word_t p1 [4];
  bitcount_t i;
  uECC_word_t *a_local;
  
  l_result[3] = 1;
  local_58 = 1;
  l_result[0] = 0;
  l_result[1] = 0;
  l_result[2] = 0;
  vli_add(l_result + 3,curve_p,l_result + 3);
  p1[3]._4_4_ = vli_numBits(l_result + 3,4);
  while (p1[3]._4_4_ = p1[3]._4_4_ + -1, 1 < p1[3]._4_4_) {
    vli_modSquare_fast(&local_58,&local_58);
    uVar1 = vli_testBit(l_result + 3,p1[3]._4_4_);
    if (uVar1 != 0) {
      vli_modMult_fast(&local_58,&local_58,a);
    }
  }
  vli_set(a,&local_58);
  return;
}

Assistant:

static void mod_sqrt(uECC_word_t *a) {
    bitcount_t i;
    uECC_word_t p1[uECC_WORDS] = {1};
    uECC_word_t l_result[uECC_WORDS] = {1};

    /* Since curve_p == 3 (mod 4) for all supported curves, we can
       compute sqrt(a) = a^((curve_p + 1) / 4) (mod curve_p). */
    vli_add(p1, curve_p, p1); /* p1 = curve_p + 1 */
    for (i = vli_numBits(p1, uECC_WORDS) - 1; i > 1; --i) {
        vli_modSquare_fast(l_result, l_result);
        if (vli_testBit(p1, i)) {
            vli_modMult_fast(l_result, l_result, a);
        }
    }
    vli_set(a, l_result);
}